

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O0

char * __thiscall
MT32Emu::Synth::getSoundGroupName(Synth *this,Bit8u timbreGroup,Bit8u timbreNumber)

{
  byte local_1a;
  Bit8u timbreNumber_local;
  Bit8u timbreGroup_local;
  Synth *this_local;
  
  local_1a = timbreNumber;
  switch(timbreGroup) {
  case '\x01':
    local_1a = timbreNumber + 0x40;
  case '\0':
    this_local = (Synth *)(this->soundGroupNames + this->soundGroupIx[local_1a]);
    break;
  case '\x02':
    this_local = (Synth *)(this->soundGroupNames + (int)(this->controlROMMap->soundGroupsCount - 2))
    ;
    break;
  case '\x03':
    this_local = (Synth *)(this->soundGroupNames + (int)(this->controlROMMap->soundGroupsCount - 1))
    ;
    break;
  default:
    this_local = (Synth *)0x0;
  }
  return (char *)this_local;
}

Assistant:

const char *Synth::getSoundGroupName(Bit8u timbreGroup, Bit8u timbreNumber) const {
	switch (timbreGroup) {
	case 1:
		timbreNumber += 64;
		// Fall-through
	case 0:
		return soundGroupNames[soundGroupIx[timbreNumber]];
	case 2:
		return soundGroupNames[controlROMMap->soundGroupsCount - 2];
	case 3:
		return soundGroupNames[controlROMMap->soundGroupsCount - 1];
	default:
		return NULL;
	}
}